

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR eval_predicate(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options,lyxp_axis axis
                     )

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  lyxp_set_node *plVar4;
  longdouble lVar5;
  lyxp_axis lVar6;
  LY_ERR LVar7;
  lyxp_axis lVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  uint32_t *puVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  LY_ERR ret__;
  lyxp_set set2;
  lyxp_axis local_108;
  lyxp_set local_c8;
  
  memset(&local_c8,0,0x90);
  pcVar18 = "skipped";
  if ((options & 0x20) == 0) {
    pcVar18 = "parsed";
  }
  pcVar9 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar18,pcVar9,(ulong)exp->tok_pos[*tok_idx]);
  uVar1 = *tok_idx;
  *tok_idx = uVar1 + 1;
  if ((options & 0x20) == 0) {
    if (set->type == LYXP_SET_NODE_SET) {
      iVar16 = set_sort(set);
      if (iVar16 != 0) {
        __assert_fail("!set_sort(set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1d61,
                      "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
                     );
      }
      uVar1 = set->used;
      if (uVar1 != 0) {
        if (set->used != 0) {
          uVar11 = 0x1fc >> ((byte)axis & 0x1f);
          uVar12 = 0;
          uVar17 = uVar1 + 1;
          if ((uVar11 & 1) != 0 || LYXP_AXIS_PRECEDING_SIBLING < axis) {
            uVar17 = 0;
          }
          uVar2 = *tok_idx;
          lVar15 = 0xc;
          do {
            uVar17 = uVar17 + (((byte)((byte)uVar11 | LYXP_AXIS_PRECEDING_SIBLING < axis) & 1) - 1 |
                              1);
            memset(&local_c8,0,0x90);
            if (set != (lyxp_set *)0x0) {
              local_c8.non_child_axis = set->non_child_axis;
              local_c8.not_found = set->not_found;
              local_c8.ctx = set->ctx;
              local_c8.field_10 = set->field_10;
              local_c8.root_type = set->root_type;
              local_c8.context_op = set->context_op;
              local_c8.tree = set->tree;
              local_c8.cur_mod = set->cur_mod;
              local_c8.format = set->format;
              local_c8.prefix_data = set->prefix_data;
              local_c8.vars = set->vars;
            }
            plVar4 = (set->val).nodes;
            set_insert_node(&local_c8,*(lyd_node **)((long)plVar4 + lVar15 + -0xc),
                            *(uint32_t *)((long)&plVar4->node + lVar15),
                            *(lyxp_node_type *)((long)plVar4 + lVar15 + -4),0);
            *tok_idx = uVar2;
            local_c8.ctx_pos = uVar17;
            local_c8.ctx_size = uVar1;
            LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,&local_c8,options);
            if ((LVar7 == LY_SUCCESS) && (local_c8.not_found != '\0')) {
              set->not_found = '\x01';
              break;
            }
            if (LVar7 != LY_SUCCESS) goto LAB_001b1bfd;
            if (local_c8.type == LYXP_SET_NUMBER) {
              lVar5 = ROUND(local_c8.val.num);
              local_c8.val.num = (longdouble)0;
              if ((long)lVar5 == (ulong)uVar17) {
                local_c8.val.num = (longdouble)1;
              }
            }
            lyxp_set_cast(&local_c8,LYXP_SET_BOOLEAN);
            if (local_c8.val.bln == '\0') {
              set_remove_node_none(set,(uint32_t)uVar12);
            }
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar12 < set->used);
        }
        set_remove_nodes_none(set);
        goto LAB_001b1dcb;
      }
    }
    else {
      if (set->type != LYXP_SET_SCNODE_SET) {
        local_c8.type = LYXP_SET_NODE_SET;
        set_fill_set(&local_c8,set);
        LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,&local_c8,options);
        if (LVar7 != LY_SUCCESS) {
LAB_001b1bfd:
          lyxp_set_free_content(&local_c8);
          return LVar7;
        }
        lyxp_set_cast(&local_c8,LYXP_SET_BOOLEAN);
        if (local_c8.val.bln == '\0') {
          lyxp_set_free_content(set);
        }
        lyxp_set_free_content(&local_c8);
        goto LAB_001b1dcb;
      }
      uVar17 = set->used;
      uVar12 = (ulong)uVar17;
      if (uVar12 == 0) {
        uVar11 = 0;
      }
      else {
        puVar14 = &((set->val).nodes)->pos;
        uVar10 = 0;
        do {
          uVar11 = uVar10;
          if (*puVar14 == 2) break;
          uVar10 = uVar10 + 1;
          puVar14 = puVar14 + 6;
          uVar11 = uVar17;
        } while (uVar17 != uVar10);
      }
      if (uVar11 != uVar17) {
        if (uVar17 != 0) {
          iVar16 = 4;
          do {
            lVar15 = 0;
            while (iVar3 = *(int *)((long)&((set->val).nodes)->pos + lVar15), iVar3 < iVar16) {
              lVar15 = lVar15 + 0x18;
              if (uVar12 * 0x18 == lVar15) goto LAB_001b1cc1;
            }
            iVar16 = iVar3 + 1;
          } while( true );
        }
        iVar16 = 4;
LAB_001b1cc1:
        if (uVar17 != 0) {
          lVar15 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar15) == 2) {
              *(int *)((long)&((set->val).nodes)->pos + lVar15) = iVar16;
            }
            lVar15 = lVar15 + 0x18;
          } while (uVar12 * 0x18 != lVar15);
        }
        if (set->used != 0) {
          lVar15 = 0xc;
          uVar12 = 0;
          local_108 = axis;
          do {
            if (*(int *)((long)&((set->val).nodes)->node + lVar15) == iVar16) {
              *(undefined4 *)((long)&((set->val).nodes)->node + lVar15) = 2;
              *tok_idx = uVar1 + 1;
              lVar8 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
              lVar6 = lVar8;
              if ((lVar8 == LYXP_AXIS_ANCESTOR) && (lVar6 = local_108, set->not_found != '\0'))
              break;
              if (lVar8 != LYXP_AXIS_ANCESTOR) {
                return lVar6;
              }
              *(int *)((long)&((set->val).nodes)->node + lVar15) = iVar16;
              local_108 = lVar6;
            }
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + 0x18;
          } while (uVar12 < set->used);
        }
        uVar17 = set->used;
        if ((ulong)uVar17 != 0) {
          lVar15 = 0;
          do {
            iVar3 = *(int *)((long)&((set->val).nodes)->pos + lVar15);
            uVar13 = 0;
            if ((iVar3 == 2) || (uVar13 = 2, iVar3 == iVar16)) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar15) = uVar13;
            }
            lVar15 = lVar15 + 0x18;
          } while ((ulong)uVar17 * 0x18 != lVar15);
        }
        goto LAB_001b1dcb;
      }
    }
  }
  LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options | 0x20);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
LAB_001b1dcb:
  if (exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2) {
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar18,"]",(ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    return LY_SUCCESS;
  }
  __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x1de3,
                "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
               );
}

Assistant:

static LY_ERR
eval_predicate(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options, enum lyxp_axis axis)
{
    LY_ERR rc;
    uint32_t i, orig_exp, orig_pos, orig_size;
    int32_t pred_in_ctx;
    ly_bool reverse_axis = 0;
    struct lyxp_set set2 = {0};

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    if (options & LYXP_SKIP_EXPR) {
only_parse:
        rc = eval_expr_select(exp, tok_idx, 0, set, options | LYXP_SKIP_EXPR);
        LY_CHECK_RET(rc);
    } else if (set->type == LYXP_SET_NODE_SET) {
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        assert(!set_sort(set));

        /* empty set, nothing to evaluate */
        if (!set->used) {
            goto only_parse;
        }

        /* decide forward or reverse axis */
        switch (axis) {
        case LYXP_AXIS_ANCESTOR:
        case LYXP_AXIS_ANCESTOR_OR_SELF:
        case LYXP_AXIS_PRECEDING:
        case LYXP_AXIS_PRECEDING_SIBLING:
            reverse_axis = 1;
            break;
        case LYXP_AXIS_DESCENDANT:
        case LYXP_AXIS_DESCENDANT_OR_SELF:
        case LYXP_AXIS_FOLLOWING:
        case LYXP_AXIS_FOLLOWING_SIBLING:
        case LYXP_AXIS_PARENT:
        case LYXP_AXIS_CHILD:
        case LYXP_AXIS_SELF:
        case LYXP_AXIS_ATTRIBUTE:
            reverse_axis = 0;
            break;
        }

        orig_exp = *tok_idx;
        orig_pos = reverse_axis ? set->used + 1 : 0;
        orig_size = set->used;
        for (i = 0; i < set->used; ++i) {
            set_init(&set2, set);
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);

            /* remember the node context position for position() and context size for last() */
            orig_pos += reverse_axis ? -1 : 1;

            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
            if (!rc && set2.not_found) {
                set->not_found = 1;
                break;
            }
            if (rc) {
                lyxp_set_free_content(&set2);
                return rc;
            }

            /* number is a proximity position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);

            /* predicate satisfied or not? */
            if (!set2.val.bln) {
                set_remove_node_none(set, i);
            }
        }
        set_remove_nodes_none(set);

    } else if (set->type == LYXP_SET_SCNODE_SET) {
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                /* there is a currently-valid node */
                break;
            }
        }
        /* empty set, nothing to evaluate */
        if (i == set->used) {
            goto only_parse;
        }

        orig_exp = *tok_idx;

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_scnode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;

            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            if (!rc && set->not_found) {
                break;
            }
            LY_CHECK_RET(rc);

            set->val.scnodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
            } else if (set->val.scnodes[i].in_ctx == pred_in_ctx) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }

    } else {
        set2.type = LYXP_SET_NODE_SET;
        set_fill_set(&set2, set);

        rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
        if (rc) {
            lyxp_set_free_content(&set2);
            return rc;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);
        if (!set2.val.bln) {
            lyxp_set_free_content(set);
        }
        lyxp_set_free_content(&set2);
    }

    /* ']' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    return LY_SUCCESS;
}